

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setMinimumDate(QDateTimeEdit *this,QDate min)

{
  QDate date;
  long in_FS_OFFSET;
  QDate local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (min.jd + 0xb69eeff91fU < 0x16d3e147974) {
    date.jd = *(qint64 *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    QDate::QDate(&stack0xffffffffffffffd0,100,1,1);
    if (local_30.jd <= min.jd) {
      ::QVariant::toTime();
      QDateTimeEditPrivate::dateTimeValue
                ((QDateTimeEditPrivate *)&stack0xffffffffffffffd0,date,(QTime)(int)min.jd);
      setMinimumDateTime(this,(QDateTime *)&stack0xffffffffffffffd0);
      QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffd0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setMinimumDate(QDate min)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && min >= QDATETIMEEDIT_DATE_MIN)
        setMinimumDateTime(d->dateTimeValue(min, d->minimum.toTime()));
}